

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix44<float> * __thiscall
Imath_3_2::Matrix44<float>::gjInverse
          (Matrix44<float> *__return_storage_ptr__,Matrix44<float> *this,bool singExc)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  float *pfVar11;
  invalid_argument *this_00;
  undefined8 *puVar12;
  undefined4 *puVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  undefined8 *puVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  Matrix44<float> s;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [6];
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  
  puVar19 = &local_b8;
  pfVar11 = local_78;
  local_78[0] = 1.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = 1.0;
  uStack_60 = 0;
  uStack_58 = 0;
  local_50 = 0x3f800000;
  local_4c = 0;
  uStack_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  local_3c = 0x3f800000;
  puVar12 = &local_a8;
  local_b8 = *(undefined8 *)this->x[0];
  uStack_b0 = *(undefined8 *)(this->x[0] + 2);
  local_a8 = *(undefined8 *)this->x[1];
  uStack_a0 = *(undefined8 *)(this->x[1] + 2);
  local_98 = *(undefined8 *)this->x[2];
  uStack_90 = *(undefined8 *)(this->x[2] + 2);
  local_88 = *(undefined8 *)this->x[3];
  uStack_80 = *(undefined8 *)(this->x[3] + 2);
  uVar17 = 1;
  lVar18 = 0x30;
  uVar20 = 0;
  do {
    pfVar2 = (float *)(&local_b8 + uVar20 * 2);
    uVar1 = uVar20 + 1;
    fVar26 = pfVar2[uVar20];
    fVar23 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar23 = fVar26;
    }
    iVar16 = (int)uVar17;
    lVar21 = 0;
    uVar14 = uVar20 & 0xffffffff;
    do {
      fVar26 = *(float *)((long)puVar12 + lVar21);
      fVar24 = -fVar26;
      if (-fVar26 <= fVar26) {
        fVar24 = fVar26;
      }
      uVar10 = uVar17;
      if (fVar24 <= fVar23) {
        fVar24 = fVar23;
        uVar10 = uVar14;
      }
      uVar14 = uVar10;
      lVar21 = lVar21 + 0x10;
      uVar17 = (ulong)((int)uVar17 + 1);
      fVar23 = fVar24;
    } while (lVar18 != lVar21);
    if ((fVar24 == 0.0) && (!NAN(fVar24))) {
      if (!singExc) goto LAB_001447d4;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
      goto LAB_00144849;
    }
    if (uVar20 != uVar14) {
      lVar22 = (long)(int)uVar14;
      lVar21 = lVar22 * 0x10 + -0xb8;
      lVar15 = 0;
      do {
        uVar5 = *(undefined4 *)((long)puVar19 + lVar15 * 4);
        *(undefined4 *)((long)puVar19 + lVar15 * 4) =
             *(undefined4 *)((long)&local_b8 + lVar15 * 4 + lVar21 + 0xb8);
        *(undefined4 *)((long)&local_b8 + lVar15 * 4 + lVar21 + 0xb8) = uVar5;
        fVar26 = pfVar11[lVar15];
        pfVar11[lVar15] = local_78[lVar22 * 4 + lVar15];
        local_78[lVar22 * 4 + lVar15] = fVar26;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
    }
    lVar21 = 0x10;
    uVar17 = uVar20;
    do {
      fVar25 = -*(float *)((long)puVar12 + lVar21 + -0x10) / pfVar2[uVar20];
      fVar26 = *(float *)((long)&local_b8 + uVar20 * 0x10 + 4);
      fVar23 = *(float *)(&uStack_b0 + uVar20 * 2);
      fVar24 = *(float *)((long)&uStack_b0 + uVar20 * 0x10 + 4);
      pfVar3 = (float *)((long)puVar19 + lVar21);
      fVar7 = pfVar3[1];
      fVar8 = pfVar3[2];
      fVar9 = pfVar3[3];
      pfVar4 = (float *)((long)puVar19 + lVar21);
      *pfVar4 = *pfVar2 * fVar25 + *pfVar3;
      pfVar4[1] = fVar26 * fVar25 + fVar7;
      pfVar4[2] = fVar23 * fVar25 + fVar8;
      pfVar4[3] = fVar24 * fVar25 + fVar9;
      fVar26 = local_78[uVar20 * 4 + 1];
      fVar23 = local_78[uVar20 * 4 + 2];
      fVar24 = local_78[uVar20 * 4 + 3];
      pfVar3 = (float *)((long)pfVar11 + lVar21);
      fVar7 = pfVar3[1];
      fVar8 = pfVar3[2];
      fVar9 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar11 + lVar21);
      *pfVar4 = fVar25 * local_78[uVar20 * 4] + *pfVar3;
      pfVar4[1] = fVar25 * fVar26 + fVar7;
      pfVar4[2] = fVar25 * fVar23 + fVar8;
      pfVar4[3] = fVar25 * fVar24 + fVar9;
      lVar21 = lVar21 + 0x10;
      uVar17 = uVar17 + 1;
    } while (uVar17 < 3);
    puVar12 = (undefined8 *)((long)puVar12 + 0x14);
    uVar17 = (ulong)(iVar16 + 1);
    lVar18 = lVar18 + -0x10;
    puVar19 = (undefined8 *)((long)puVar19 + 0x10);
    pfVar11 = pfVar11 + 4;
    uVar20 = uVar1;
  } while (uVar1 != 3);
  if ((uStack_80._4_4_ != 0.0) || (NAN(uStack_80._4_4_))) {
    puVar12 = &local_88;
    puVar13 = &uStack_48;
    lVar18 = 3;
    fVar26 = uStack_80._4_4_;
    do {
      auVar27._4_4_ = fVar26;
      auVar27._0_4_ = fVar26;
      auVar27._8_4_ = fVar26;
      auVar27._12_4_ = fVar26;
      auVar27 = divps(*(undefined1 (*) [16])(&local_b8 + lVar18 * 2),auVar27);
      *(undefined1 (*) [16])(&local_b8 + lVar18 * 2) = auVar27;
      auVar6._4_4_ = fVar26;
      auVar6._0_4_ = fVar26;
      auVar6._8_4_ = fVar26;
      auVar6._12_4_ = fVar26;
      auVar27 = divps(*(undefined1 (*) [16])(local_78 + lVar18 * 4),auVar6);
      *(undefined1 (*) [16])(local_78 + lVar18 * 4) = auVar27;
      lVar21 = lVar18 + -1;
      if (lVar18 == 0) {
        *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(local_78[1],local_78[0]);
        *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(local_78[3],local_78[2]);
        *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(local_78[5],local_78[4]);
        *(undefined8 *)(__return_storage_ptr__->x[1] + 2) = uStack_60;
        *(undefined8 *)__return_storage_ptr__->x[2] = uStack_58;
        *(ulong *)(__return_storage_ptr__->x[2] + 2) = CONCAT44(local_4c,local_50);
        *(ulong *)__return_storage_ptr__->x[3] = CONCAT44(uStack_44,uStack_48);
        *(ulong *)(__return_storage_ptr__->x[3] + 2) = CONCAT44(local_3c,uStack_40);
        return __return_storage_ptr__;
      }
      lVar15 = 0;
      puVar19 = &local_b8;
      pfVar11 = local_78;
      do {
        fVar26 = -*(float *)((long)&local_b8 + lVar18 * 4 + lVar15 * 0x10);
        lVar22 = 0;
        do {
          fVar23 = *(float *)((long)puVar13 + lVar22);
          fVar24 = *(float *)((long)pfVar11 + lVar22);
          *(float *)((long)puVar19 + lVar22) =
               *(float *)((long)puVar12 + lVar22) * fVar26 + *(float *)((long)puVar19 + lVar22);
          *(float *)((long)pfVar11 + lVar22) = fVar23 * fVar26 + fVar24;
          lVar22 = lVar22 + 4;
        } while (lVar22 != 0x10);
        lVar15 = lVar15 + 1;
        puVar19 = (undefined8 *)((long)puVar19 + 0x10);
        pfVar11 = pfVar11 + 4;
      } while (lVar15 != lVar18);
      fVar26 = *(float *)((long)&local_b8 + lVar21 * 0x14);
      puVar12 = puVar12 + -2;
      puVar13 = puVar13 + -4;
      lVar18 = lVar21;
    } while ((fVar26 != 0.0) || (NAN(fVar26)));
  }
  if (!singExc) {
LAB_001447d4:
    __return_storage_ptr__->x[0][0] = 1.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
    *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
    __return_storage_ptr__->x[1][1] = 1.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
    *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Cannot invert singular matrix.");
LAB_00144849:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline Matrix44<T>
Matrix44<T>::gjInverse (bool singExc) const
{
    int      i, j, k;
    Matrix44 s;
    Matrix44 t (*this);

    // Forward elimination

    for (i = 0; i < 3; i++)
    {
        int pivot = i;

        T pivotsize = t.x[i][i];

        if (pivotsize < 0) pivotsize = -pivotsize;

        for (j = i + 1; j < 4; j++)
        {
            T tmp = t.x[j][i];

            if (tmp < 0) tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot     = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix44 ();
        }

        if (pivot != i)
        {
            for (j = 0; j < 4; j++)
            {
                T tmp;

                tmp           = t.x[i][j];
                t.x[i][j]     = t.x[pivot][j];
                t.x[pivot][j] = tmp;

                tmp           = s.x[i][j];
                s.x[i][j]     = s.x[pivot][j];
                s.x[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 4; j++)
        {
            T f = t.x[j][i] / t.x[i][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 3; i >= 0; --i)
    {
        T f;

        if ((f = t.x[i][i]) == 0)
        {
            if (singExc)
                throw std::invalid_argument ("Cannot invert singular matrix.");

            return Matrix44 ();
        }

        for (j = 0; j < 4; j++)
        {
            t.x[i][j] /= f;
            s.x[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t.x[j][i];

            for (k = 0; k < 4; k++)
            {
                t.x[j][k] -= f * t.x[i][k];
                s.x[j][k] -= f * s.x[i][k];
            }
        }
    }

    return s;
}